

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

string * __thiscall
baryonyx::to_string_abi_cxx11_
          (string *__return_storage_ptr__,baryonyx *this,
          tuple<double,_baryonyx::show_size_type> *mem)

{
  __tuple_element_t<1UL,_tuple<double,_show_size_type>_> _Var1;
  __tuple_element_t<1UL,_tuple<double,_show_size_type>_> *p_Var2;
  char (*format_str) [10];
  char (*format_str_00) [10];
  char (*format_str_01) [10];
  char (*format_str_02) [9];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  tuple<double,_baryonyx::show_size_type> *mem_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1e8;
  basic_string_view<char> local_1d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
  *vargs_2;
  char *local_1a8;
  string *local_1a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_198;
  basic_string_view<char> local_188;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_178;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
  *vargs_1;
  char *local_158;
  string *local_150;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_148;
  basic_string_view<char> local_138;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_128;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
  *vargs;
  char *local_108;
  string *local_100;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_f8;
  basic_string_view<char> local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
  *vargs_3;
  char *local_b8;
  string *local_b0;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_70;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_68;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  p_Var2 = std::get<1ul,double,baryonyx::show_size_type>
                     ((tuple<double,_baryonyx::show_size_type> *)this);
  _Var1 = *p_Var2;
  if (_Var1 == GB) {
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
             *)std::get<0ul,double,baryonyx::show_size_type>
                         ((tuple<double,_baryonyx::show_size_type> *)this);
    local_108 = "{:.2f} GB";
    local_100 = __return_storage_ptr__;
    local_128.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<double&,char[10],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
                     *)"{:.2f} GB",(v7 *)vargs,format_str,
                    (remove_reference_t<double_&> *)"{:.2f} GB");
    local_118 = &local_128;
    local_138 = ::fmt::v7::to_string_view<char,_0>(local_108);
    local_90 = &local_148;
    local_98 = local_118;
    local_48 = local_118;
    local_20 = local_118;
    local_40 = local_90;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_90,10,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_118->string);
    format_str_03.size_ = local_148.desc_;
    format_str_03.data_ = (char *)local_138.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_148.field_1.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_138.data_,format_str_03,args);
  }
  else if (_Var1 == MB) {
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
               *)std::get<0ul,double,baryonyx::show_size_type>
                           ((tuple<double,_baryonyx::show_size_type> *)this);
    local_158 = "{:.2f} MB";
    local_150 = __return_storage_ptr__;
    local_178.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<double&,char[10],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
                     *)"{:.2f} MB",(v7 *)vargs_1,format_str_00,
                    (remove_reference_t<double_&> *)"{:.2f} MB");
    local_168 = &local_178;
    local_188 = ::fmt::v7::to_string_view<char,_0>(local_158);
    local_80 = &local_198;
    local_88 = local_168;
    local_58 = local_168;
    local_18 = local_168;
    local_50 = local_80;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_80,10,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_168->string);
    format_str_04.size_ = local_198.desc_;
    format_str_04.data_ = (char *)local_188.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_198.field_1.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_188.data_,format_str_04,args_00);
  }
  else if (_Var1 == KB) {
    vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
               *)std::get<0ul,double,baryonyx::show_size_type>
                           ((tuple<double,_baryonyx::show_size_type> *)this);
    local_1a8 = "{:.2f} KB";
    local_1a0 = __return_storage_ptr__;
    local_1c8.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<double&,char[10],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
                     *)"{:.2f} KB",(v7 *)vargs_2,format_str_01,
                    (remove_reference_t<double_&> *)"{:.2f} KB");
    local_1b8 = &local_1c8;
    local_1d8 = ::fmt::v7::to_string_view<char,_0>(local_1a8);
    local_70 = &local_1e8;
    local_78 = local_1b8;
    local_68 = local_1b8;
    local_10 = local_1b8;
    local_60 = local_70;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_70,10,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_1b8->string);
    format_str_05.size_ = local_1e8.desc_;
    format_str_05.data_ = (char *)local_1d8.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1e8.field_1.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_1d8.data_,format_str_05,args_01);
  }
  else {
    vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
               *)std::get<0ul,double,baryonyx::show_size_type>
                           ((tuple<double,_baryonyx::show_size_type> *)this);
    local_b8 = "{:.2f} B";
    local_b0 = __return_storage_ptr__;
    local_d8.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<double&,char[9],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double>
                     *)"{:.2f} B",(v7 *)vargs_3,format_str_02,
                    (remove_reference_t<double_&> *)"{:.2f} B");
    local_c8 = &local_d8;
    local_e8 = ::fmt::v7::to_string_view<char,_0>(local_b8);
    local_a0 = &local_f8;
    local_a8 = local_c8;
    local_38 = local_c8;
    local_28 = local_c8;
    local_30 = local_a0;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_a0,10,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_c8->string);
    format_str_06.size_ = local_f8.desc_;
    format_str_06.data_ = (char *)local_e8.size_;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_f8.field_1.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_e8.data_,format_str_06,args_02);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
to_string(std::tuple<double, show_size_type> mem)
{
    switch (std::get<1>(mem)) {
    case show_size_type::GB:
        return fmt::format("{:.2f} GB", std::get<0>(mem));
    case show_size_type::MB:
        return fmt::format("{:.2f} MB", std::get<0>(mem));
    case show_size_type::KB:
        return fmt::format("{:.2f} KB", std::get<0>(mem));
    default:
        return fmt::format("{:.2f} B", std::get<0>(mem));
    }
}